

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O0

void __thiscall
dtc::fdt::checking::property_checker::property_checker
          (property_checker *this,char *name,string *property_name)

{
  string *property_name_local;
  char *name_local;
  property_checker *this_local;
  
  checker::checker(&this->super_checker,name);
  (this->super_checker)._vptr_checker = (_func_int **)&PTR__property_checker_001dfde0;
  std::__cxx11::string::string((string *)&this->key,(string *)property_name);
  return;
}

Assistant:

property_checker(const char* name, const std::string &property_name)
		: checker(name), key(property_name) {}